

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::remove_vertex(Graph *this,vertex_t v)

{
  uint *puVar1;
  pointer pvVar2;
  uint *puVar3;
  undefined4 in_EAX;
  ulong uVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var5
  ;
  pointer puVar6;
  ulong uVar7;
  uint *puVar8;
  uint *i;
  uint *puVar9;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT44(v,in_EAX);
  uVar4 = (ulong)v;
  pvVar2 = (this->pred_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->pred_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
          -0x5555555555555555;
  if (uVar4 <= uVar7 && uVar7 - uVar4 != 0) {
    puVar9 = pvVar2[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = *(pointer *)
              ((long)&pvVar2[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 8);
    if (puVar9 != puVar3) {
      do {
        uVar4 = (ulong)*puVar9;
        pvVar2 = (this->succ_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(this->succ_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                -0x5555555555555555;
        if (uVar7 < uVar4 || uVar7 - uVar4 == 0) goto LAB_001039dc;
        pvVar2 = pvVar2 + uVar4;
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                          (*(undefined8 *)
                            &(pvVar2->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl,
                           *(pointer *)
                            ((long)&(pvVar2->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl + 8),(long)&uStack_38 + 4);
        puVar1 = _Var5._M_current + 1;
        puVar8 = *(pointer *)
                  ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl + 8);
        if (puVar1 != puVar8) {
          memmove(_Var5._M_current,puVar1,(long)puVar8 - (long)puVar1);
          puVar8 = *(pointer *)
                    ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl + 8);
        }
        *(uint **)((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl + 8) = puVar8 + -1;
        uVar4 = (ulong)*puVar9;
        puVar6 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->deg_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar6 >> 2) <= uVar4)
        goto LAB_001039dc;
        puVar6 = puVar6 + uVar4;
        *puVar6 = *puVar6 - 1;
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar3);
      uVar4 = (ulong)uStack_38._4_4_;
      v = uStack_38._4_4_;
    }
    pvVar2 = (this->succ_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->succ_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
            -0x5555555555555555;
    if (uVar4 <= uVar7 && uVar7 - uVar4 != 0) {
      puVar9 = *(uint **)&pvVar2[uVar4].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      puVar3 = *(pointer *)
                ((long)&pvVar2[uVar4].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)
      ;
      if (puVar9 == puVar3) {
        puVar6 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2;
      }
      else {
        do {
          uVar4 = (ulong)*puVar9;
          pvVar2 = (this->pred_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(this->pred_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                  -0x5555555555555555;
          if (uVar7 < uVar4 || uVar7 - uVar4 == 0) goto LAB_001039dc;
          pvVar2 = pvVar2 + uVar4;
          _Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                            ((pvVar2->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start,
                             *(pointer *)
                              ((long)&(pvVar2->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data + 8),(long)&uStack_38 + 4);
          puVar1 = _Var5._M_current + 1;
          puVar8 = *(pointer *)
                    ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data + 8);
          if (puVar1 != puVar8) {
            memmove(_Var5._M_current,puVar1,(long)puVar8 - (long)puVar1);
            puVar8 = *(pointer *)
                      ((long)&(pvVar2->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data + 8);
          }
          *(uint **)((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data + 8) = puVar8 + -1;
          uVar4 = (ulong)*puVar9;
          puVar6 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = (long)(this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2;
          if (uVar7 <= uVar4) goto LAB_001039dc;
          puVar6[uVar4] = puVar6[uVar4] - 1;
          puVar9 = puVar9 + 1;
        } while (puVar9 != puVar3);
        v = uStack_38._4_4_;
      }
      uVar4 = (ulong)v;
      if (uVar4 < uVar7) {
        puVar6[uVar4] = 0;
        uVar4 = uStack_38 >> 0x20;
        pvVar2 = (this->succ_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(this->succ_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                -0x5555555555555555;
        if (uVar4 <= uVar7 && uVar7 - uVar4 != 0) {
          puVar6 = *(pointer *)
                    &pvVar2[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl;
          if (*(pointer *)
               ((long)&pvVar2[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl + 8) != puVar6) {
            *(pointer *)
             ((long)&pvVar2[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl + 8) = puVar6;
          }
          pvVar2 = (this->pred_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(this->pred_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                  -0x5555555555555555;
          if (uVar4 <= uVar7 && uVar7 - uVar4 != 0) {
            puVar6 = pvVar2[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (*(pointer *)
                 ((long)&pvVar2[uVar4].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8) != puVar6) {
              *(pointer *)
               ((long)&pvVar2[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data + 8) = puVar6;
            }
            return;
          }
        }
      }
    }
  }
LAB_001039dc:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

void Graph::remove_vertex(vertex_t v) {
    for (const auto &i : pred_.at(v)) {
        succ_.at(i).erase(find(succ_.at(i).begin(), succ_.at(i).end(), v));
        --deg_.at(i);
    }
    for (const auto &i : succ_.at(v)) {
        pred_.at(i).erase(find(pred_.at(i).begin(), pred_.at(i).end(), v));
        --deg_.at(i);
    }
    deg_.at(v) = 0;

    succ_.at(v).clear();
    pred_.at(v).clear();
}